

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::insert
          (QMovableArrayOps<QRectF> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QRectF *pQVar2;
  Inserter *in_RCX;
  long lVar3;
  long in_RDX;
  QArrayDataPointer<QRectF> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  QRectF copy;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  undefined3 in_stack_ffffffffffffff8c;
  uint uVar6;
  Inserter local_50;
  QArrayDataPointer<QRectF> *local_28;
  QRectF *local_20;
  QRectF *local_18;
  qreal local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RCX->data;
  local_20 = in_RCX->displaceFrom;
  local_18 = in_RCX->displaceTo;
  local_10 = (qreal)in_RCX->nInserts;
  bVar4 = *(long *)(in_RDI + 0x10) != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QRectF> *)0x0;
  uVar6 = CONCAT13(uVar5,in_stack_ffffffffffffff8c);
  uVar1 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QRectF> *)0x0);
  QArrayDataPointer<QRectF>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QRectF **)CONCAT44(uVar6,uVar1),
             (QArrayDataPointer<QRectF> *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if ((uVar6 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<QRectF> *)CONCAT44(uVar6,uVar1),
                       CONCAT17(uVar5,in_stack_ffffffffffffff80),in_RDI);
    Inserter::insertFill
              (in_RCX,(QRectF *)CONCAT44(uVar6,uVar1),CONCAT17(uVar5,in_stack_ffffffffffffff80));
    Inserter::~Inserter(&local_50);
  }
  else {
    while (lVar3 = in_RDX + -1, in_RDX != 0) {
      pQVar2 = QArrayDataPointer<QRectF>::begin((QArrayDataPointer<QRectF> *)0x9e741d);
      pQVar2[-1].xp = (qreal)local_28;
      pQVar2[-1].yp = (qreal)local_20;
      pQVar2[-1].w = (qreal)local_18;
      pQVar2[-1].h = local_10;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -0x20;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      in_RDX = lVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }